

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::addBuffer(CLIntercept *this,cl_mem buffer)

{
  mapped_type mVar1;
  uint uVar2;
  cl_icd_dispatch *pcVar3;
  mapped_type *pmVar4;
  mapped_type_conflict *pmVar5;
  cl_mem in_RSI;
  CLIntercept *in_RDI;
  size_t size;
  cl_int errorCode;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff88;
  mapped_type_conflict mVar6;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  key_type *in_stack_ffffffffffffffc8;
  map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
  *in_stack_ffffffffffffffd0;
  mapped_type_conflict local_28;
  uint local_1c;
  cl_mem local_10;
  
  if (in_RSI != (cl_mem)0x0) {
    local_10 = in_RSI;
    std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_1c = 0;
    local_28 = 0;
    pcVar3 = dispatch(in_RDI);
    uVar2 = (*pcVar3->clGetMemObjectInfo)(local_10,0x1102,8,&local_28,(size_t *)0x0);
    local_1c = uVar2 | local_1c;
    if (local_1c == 0) {
      mVar1 = in_RDI->m_MemAllocNumber;
      pmVar4 = std::
               map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
               ::operator[]((map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
                             *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      *pmVar4 = mVar1;
      mVar6 = local_28;
      pmVar5 = std::
               map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
               ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      *pmVar5 = mVar6;
      in_RDI->m_MemAllocNumber = in_RDI->m_MemAllocNumber + 1;
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x20ae45);
  }
  return;
}

Assistant:

void CLIntercept::addBuffer(
    cl_mem buffer )
{
    if( buffer )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        cl_int  errorCode = CL_SUCCESS;
        size_t  size = 0;

        errorCode |= dispatch().clGetMemObjectInfo(
            buffer,
            CL_MEM_SIZE,
            sizeof( size_t ),
            &size,
            NULL );

        if( errorCode == CL_SUCCESS )
        {
            m_MemAllocNumberMap[ buffer ] = m_MemAllocNumber;
            m_BufferInfoMap[ buffer ] = size;
            m_MemAllocNumber++;
        }
    }
}